

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void cnv_trap_obj(int otyp,int cnt,trap *ttmp)

{
  uint uVar1;
  obj *obj;
  obj *otmp;
  trap *ttmp_local;
  int cnt_local;
  int otyp_local;
  
  obj = mksobj(level,otyp,'\x01','\0');
  obj->quan = cnt;
  uVar1 = weight(obj);
  obj->owt = uVar1;
  if ((otyp != 7) && (otyp != 8)) {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffff7fff;
  }
  place_object(obj,level,(int)ttmp->tx,(int)ttmp->ty);
  if ((char)ttmp->field_0x8 < '\0') {
    sellobj(obj,ttmp->tx,ttmp->ty);
  }
  stackobj(obj);
  newsym((int)ttmp->tx,(int)ttmp->ty);
  deltrap(level,ttmp);
  return;
}

Assistant:

static void cnv_trap_obj(int otyp, int cnt, struct trap *ttmp)
{
	struct obj *otmp = mksobj(level, otyp, TRUE, FALSE);
	otmp->quan=cnt;
	otmp->owt = weight(otmp);
	/* Only dart and shuriken traps are capable of being poisonous */
	if (otyp != DART && otyp != SHURIKEN)
	    otmp->opoisoned = 0;
	place_object(otmp, level, ttmp->tx, ttmp->ty);
	/* Sell your own traps only... */
	if (ttmp->madeby_u) sellobj(otmp, ttmp->tx, ttmp->ty);
	stackobj(otmp);
	newsym(ttmp->tx, ttmp->ty);
	deltrap(level, ttmp);
}